

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Simple_Error_outparameter_nullptr_Test::TestBody
          (CoinSelection_SelectCoins_Simple_Error_outparameter_nullptr_Test *this)

{
  bool bVar1;
  Amount AVar2;
  CfdException *anon_var_0;
  CoinSelectionOption *in_stack_00000068;
  UtxoFilter *in_stack_00000070;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_00000078;
  Amount *in_stack_00000080;
  CoinSelection *in_stack_00000088;
  Amount *in_stack_000000a0;
  Amount *in_stack_000000a8;
  Amount *in_stack_000000b0;
  bool *in_stack_000000b8;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  bool use_bnb;
  Amount tx_fee;
  Amount fee;
  Amount select_value;
  Amount target_amount;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *this_00;
  AssertHelper local_148;
  Message local_140 [24];
  byte local_79;
  ConstCharPtr local_78;
  undefined1 local_69 [25];
  undefined1 local_50;
  Amount local_48;
  Amount local_38;
  int64_t local_28;
  undefined1 local_20;
  int64_t local_18;
  undefined1 local_10;
  
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(100000000);
  local_28 = AVar2.amount_;
  local_20 = AVar2.ignore_check_;
  local_18 = local_28;
  local_10 = local_20;
  cfd::core::Amount::Amount(&local_38);
  cfd::core::Amount::Amount(&local_48);
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_69._1_8_ = AVar2.amount_;
  local_69[9] = AVar2.ignore_check_;
  local_69[0] = 0;
  local_69._17_8_ = local_69._1_8_;
  local_50 = local_69[9];
  testing::internal::ConstCharPtr::ConstCharPtr(&local_78,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_78);
  if (bVar1) {
    local_79 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      GetBitcoinUtxoList();
      GetBitcoinOption();
      this_00 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_69;
      cfd::CoinSelection::SelectCoins
                (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070,
                 in_stack_00000068,in_stack_000000a0,in_stack_000000a8,in_stack_000000b0,
                 in_stack_000000b8);
      cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x27079e);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(this_00);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(this_00);
    }
    if ((local_79 & 1) != 0) {
      return;
    }
    local_78.value =
         "Expected: std::vector<Utxo> ret = exp_selection.SelectCoins( target_amount, GetBitcoinUtxoList(), exp_filter, GetBitcoinOption(), tx_fee, nullptr, &fee, &use_bnb) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_140);
  testing::internal::AssertHelper::AssertHelper
            (&local_148,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
             ,0x225,local_78.value);
  testing::internal::AssertHelper::operator=(&local_148,local_140);
  testing::internal::AssertHelper::~AssertHelper(&local_148);
  testing::Message::~Message((Message *)0x2708e6);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_Error_outparameter_nullptr)
{
  Amount target_amount = Amount::CreateBySatoshiAmount(100000000);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;
  EXPECT_THROW(std::vector<Utxo> ret = exp_selection.SelectCoins(
      target_amount, GetBitcoinUtxoList(), exp_filter, GetBitcoinOption(),
      tx_fee, nullptr, &fee, &use_bnb), CfdException);
}